

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-h1-proxy.c
# Opt level: O1

CURLcode cf_h1_proxy_connect(Curl_cfilter *cf,Curl_easy *data,_Bool blocking,_Bool *done)

{
  curl_trc_feat *pcVar1;
  Curl_handler *pCVar2;
  ulong uVar3;
  dynbuf *pdVar4;
  _Bool _Var5;
  CURLcode CVar6;
  int iVar7;
  h1_tunnel_state_conflict *s;
  timediff_t tVar8;
  char *pcVar9;
  size_t sVar10;
  size_t size;
  h1_tunnel_state_conflict *phVar11;
  long lVar12;
  bool bVar13;
  char byte;
  ssize_t nread;
  _Bool local_92;
  char local_91;
  h1_tunnel_state_conflict *local_90;
  httpreq *local_88;
  int local_7c;
  long local_78;
  size_t *local_70;
  char *local_68;
  connectdata *local_60;
  size_t local_58;
  Curl_chunker *local_50;
  dynbuf *local_48;
  SingleRequest *local_40;
  size_t local_38;
  
  if ((cf->field_0x24 & 1) != 0) {
    *done = true;
    return CURLE_OK;
  }
  phVar11 = (h1_tunnel_state_conflict *)cf->ctx;
  if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) {
    pcVar1 = (data->state).feat;
    if (pcVar1 == (curl_trc_feat *)0x0) {
      if (cf != (Curl_cfilter *)0x0) goto LAB_0011303b;
    }
    else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar1->log_level)) {
LAB_0011303b:
      if (0 < cf->cft->log_level) {
        Curl_trc_cf_infof(data,cf,"connect");
      }
    }
  }
  CVar6 = (*cf->next->cft->do_connect)(cf->next,data,blocking,done);
  if (CVar6 != CURLE_OK) {
    return CVar6;
  }
  if (*done != true) {
    return CURLE_OK;
  }
  *done = false;
  CVar6 = CURLE_OK;
  if (phVar11 == (h1_tunnel_state_conflict *)0x0) {
    pCVar2 = cf->conn->handler;
    if ((pCVar2->flags & 0x4000) == 0) {
      s = (h1_tunnel_state_conflict *)(*Curl_ccalloc)(1,0xb0);
      if (s == (h1_tunnel_state_conflict *)0x0) {
        CVar6 = CURLE_OUT_OF_MEMORY;
        goto LAB_001131a6;
      }
      if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
         ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level))))
      {
        Curl_infof(data,"allocate connect buffer");
      }
      Curl_dyn_init((dynbuf *)s,0x4000);
      Curl_dyn_init(&s->request_data,0x100000);
      Curl_httpchunk_init(data,&s->ch,true);
      CVar6 = CURLE_OK;
      Curl_conncontrol(cf->conn,0);
      Curl_dyn_reset((dynbuf *)s);
      Curl_dyn_reset(&s->request_data);
      s->tunnel_state = H1_TUNNEL_INIT;
      s->keepon = KEEPON_CONNECT;
      s->cl = 0;
      s->field_0xac = s->field_0xac & 0xfd;
      bVar13 = true;
      phVar11 = s;
    }
    else {
      Curl_failf(data,"%s cannot be done over CONNECT",pCVar2->scheme);
      CVar6 = CURLE_UNSUPPORTED_PROTOCOL;
LAB_001131a6:
      bVar13 = false;
    }
    if (!bVar13) {
      return CVar6;
    }
    cf->ctx = phVar11;
  }
  local_60 = cf->conn;
  if (phVar11 == (h1_tunnel_state_conflict *)0x0) {
LAB_001131e0:
    local_48 = &phVar11->request_data;
    local_70 = &phVar11->nsent;
    local_50 = &phVar11->ch;
    local_40 = &data->req;
    local_78 = 3;
    local_90 = phVar11;
    do {
      tVar8 = Curl_timeleft(data,(curltime *)0x0,true);
      if (tVar8 < 1) {
        bVar13 = false;
        Curl_failf(data,"Proxy CONNECT aborted due to timeout");
        CVar6 = CURLE_OPERATION_TIMEDOUT;
        goto LAB_00113c60;
      }
      switch(phVar11->tunnel_state) {
      case H1_TUNNEL_INIT:
        if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) {
          pcVar1 = (data->state).feat;
          if (pcVar1 == (curl_trc_feat *)0x0) {
            if (cf != (Curl_cfilter *)0x0) goto LAB_00113297;
          }
          else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar1->log_level)) {
LAB_00113297:
            if (0 < cf->cft->log_level) {
              Curl_trc_cf_infof(data,cf,"CONNECT start");
            }
          }
        }
        local_88 = (httpreq *)0x0;
        (*Curl_cfree)((data->req).newurl);
        (data->req).newurl = (char *)0x0;
        CVar6 = Curl_http_proxy_create_CONNECT(&local_88,cf,data,1);
        if (CVar6 == CURLE_OK) {
          if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
             ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 ||
              (0 < pcVar1->log_level)))) {
            Curl_infof(data,"Establish HTTP proxy tunnel to %s",local_88->authority);
          }
          pdVar4 = local_48;
          Curl_dyn_reset(local_48);
          *local_70 = 0;
          local_70[1] = 0;
          CVar6 = Curl_h1_req_write_head
                            (local_88,(uint)((cf->conn->http_proxy).proxytype != '\x01'),pdVar4);
          if (CVar6 == CURLE_OK) {
            CVar6 = Curl_creader_set_null(data);
          }
        }
        if (CVar6 != CURLE_OK) {
          Curl_failf(data,"Failed sending CONNECT to proxy");
        }
        if (local_88 != (httpreq *)0x0) {
          Curl_http_req_free(local_88);
        }
        if (CVar6 == CURLE_OK) {
          h1_tunnel_go_state(cf,phVar11,H1_TUNNEL_CONNECT,data);
          goto switchD_0011324b_caseD_1;
        }
        break;
      case H1_TUNNEL_CONNECT:
switchD_0011324b_caseD_1:
        if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) {
          pcVar1 = (data->state).feat;
          if (pcVar1 == (curl_trc_feat *)0x0) {
            if (cf != (Curl_cfilter *)0x0) goto LAB_001133d5;
          }
          else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar1->log_level)) {
LAB_001133d5:
            if (0 < cf->cft->log_level) {
              Curl_trc_cf_infof(data,cf,"CONNECT send");
            }
          }
        }
        pdVar4 = local_48;
        pcVar9 = Curl_dyn_ptr(local_48);
        sVar10 = Curl_dyn_len(pdVar4);
        local_88 = (httpreq *)((ulong)local_88 & 0xffffffff00000000);
        uVar3 = *local_70;
        if (uVar3 <= sVar10 && sVar10 - uVar3 != 0) {
          size = (*cf->next->cft->do_send)
                           (cf->next,data,pcVar9 + uVar3,sVar10 - uVar3,false,(CURLcode *)&local_88)
          ;
          if ((long)size < 0) {
            if ((CURLcode)local_88 == 0x51) {
              local_88 = (httpreq *)((ulong)local_88 & 0xffffffff00000000);
            }
          }
          else {
            *local_70 = *local_70 + size;
            Curl_debug(data,CURLINFO_HEADER_OUT,pcVar9 + uVar3,size);
          }
        }
        if ((CURLcode)local_88 != 0) {
          Curl_failf(data,"Failed sending CONNECT to proxy");
        }
        phVar11 = local_90;
        CVar6 = (CURLcode)local_88;
        if ((CURLcode)local_88 == CURLE_OK) {
          local_92 = sVar10 <= *local_70;
          if (local_92) {
            h1_tunnel_go_state(cf,local_90,H1_TUNNEL_RECEIVE,data);
            goto switchD_0011324b_caseD_2;
          }
        }
        else {
          local_92 = false;
        }
        break;
      case H1_TUNNEL_RECEIVE:
switchD_0011324b_caseD_2:
        if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) {
          pcVar1 = (data->state).feat;
          if (pcVar1 == (curl_trc_feat *)0x0) {
            if (cf != (Curl_cfilter *)0x0) goto LAB_001134f8;
          }
          else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar1->log_level)) {
LAB_001134f8:
            if (0 < cf->cft->log_level) {
              Curl_trc_cf_infof(data,cf,"CONNECT receive");
            }
          }
        }
        local_92 = false;
        _Var5 = Curl_conn_data_pending(data,cf->sockindex);
        if (_Var5) {
          if (phVar11->keepon == KEEPON_DONE) {
            CVar6 = CURLE_OK;
          }
          else {
            local_7c = 0;
            do {
              CVar6 = Curl_conn_recv(data,cf->sockindex,&local_91,1,(ssize_t *)&local_88);
              lVar12 = 1;
              if ((CVar6 == CURLE_AGAIN) ||
                 (iVar7 = Curl_pgrsUpdate(data), phVar11 = local_90, iVar7 != 0)) goto LAB_00113588;
              if (CVar6 != CURLE_OK) {
                local_90->keepon = KEEPON_DONE;
                CVar6 = (*(code *)((long)&DAT_001752e0 + (long)(int)(&DAT_001752e0)[local_78]))();
                return CVar6;
              }
              if ((long)local_88 < 1) {
                if ((((data->set).proxyauth == 0) || ((data->state).authproxy.avail == 0)) ||
                   ((data->state).aptr.proxyuserpwd == (char *)0x0)) {
                  Curl_failf(data,"Proxy CONNECT aborted");
                  local_7c = 1;
                }
                else {
                  local_90->field_0xac = local_90->field_0xac | 2;
                  if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
                     ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 ||
                      (0 < pcVar1->log_level)))) {
                    Curl_infof(data,"Proxy CONNECT connection closed");
                    phVar11->keepon = KEEPON_DONE;
                    CVar6 = (*(code *)((long)&DAT_001752e0 + (long)(int)(&DAT_001752e0)[local_78]))
                                      ();
                    return CVar6;
                  }
                }
                phVar11->keepon = KEEPON_DONE;
                CVar6 = (*(code *)((long)&DAT_001752e0 + (long)(int)(&DAT_001752e0)[local_78]))();
                return CVar6;
              }
              if (local_90->keepon == KEEPON_IGNORE) {
                lVar12 = local_90->cl;
                if (lVar12 == 0) {
                  if ((local_90->field_0xac & 1) != 0) {
                    local_38 = 0;
                    CVar6 = Curl_httpchunk_read(data,local_50,&local_91,1,&local_38);
                    lVar12 = 1;
                    if (CVar6 == CURLE_OK) {
                      _Var5 = Curl_httpchunk_is_done(data,local_50);
                      lVar12 = 2;
                      if (_Var5) {
                        if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0))
                           && ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 ||
                               (0 < pcVar1->log_level)))) {
                          Curl_infof(data,"chunk reading DONE");
                        }
                        local_90->keepon = KEEPON_DONE;
                      }
                    }
                    CVar6 = (*(code *)((long)&DAT_001752e0 + (long)(int)(&DAT_001752e0)[lVar12]))();
                    return CVar6;
                  }
                }
                else {
                  local_90->cl = lVar12 + -1;
                  if (lVar12 < 2) {
                    local_90->keepon = KEEPON_DONE;
                    CVar6 = (*(code *)((long)&DAT_001752e0 + (long)(int)(&DAT_001752e0)[local_78]))
                                      ();
                    return CVar6;
                  }
                }
                lVar12 = 2;
                goto LAB_00113588;
              }
              CVar6 = Curl_dyn_addn(&local_90->rcvbuf,&local_91,1);
              phVar11 = local_90;
              if (CVar6 != CURLE_OK) {
                Curl_failf(data,"CONNECT response too large");
                CVar6 = CURLE_RECV_ERROR;
                phVar11 = local_90;
                goto LAB_00113ade;
              }
              if (local_91 != '\n') goto LAB_001139f6;
              local_90->headerlines = local_90->headerlines + 1;
              local_68 = Curl_dyn_ptr(&local_90->rcvbuf);
              local_58 = Curl_dyn_len(&phVar11->rcvbuf);
              Curl_debug(data,CURLINFO_HEADER_IN,local_68,local_58);
              CVar6 = Curl_client_write(data,(uint)(local_90->headerlines == 1) * 8 + 0x14,local_68,
                                        local_58);
              if ((CVar6 != CURLE_OK) ||
                 (CVar6 = Curl_bump_headersize(data,local_58,true), CVar6 != CURLE_OK)) {
LAB_00113806:
                lVar12 = 1;
LAB_00113588:
                CVar6 = (*(code *)((long)&DAT_001752e0 + (long)(int)(&DAT_001752e0)[lVar12]))();
                return CVar6;
              }
              if ((*local_68 != '\r') && (*local_68 != '\n')) {
                CVar6 = on_resp_header(cf,data,local_90,local_68);
                if (CVar6 == CURLE_OK) {
                  Curl_dyn_reset(&local_90->rcvbuf);
                  lVar12 = 0;
                  goto LAB_00113588;
                }
                goto LAB_00113806;
              }
              if (((data->req).httpcode == 0x197) && (((data->state).field_0x774 & 0x20) == 0)) {
                local_90->keepon = KEEPON_IGNORE;
                if (local_90->cl == 0) {
                  if ((local_90->field_0xac & 1) == 0) {
                    if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) {
                      pcVar1 = (data->state).feat;
                      if (pcVar1 == (curl_trc_feat *)0x0) {
                        if (cf != (Curl_cfilter *)0x0) goto LAB_00113a43;
                      }
                      else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar1->log_level)) {
LAB_00113a43:
                        if (0 < cf->cft->log_level) {
                          Curl_trc_cf_infof(data,cf,"CONNECT: no content-length or chunked");
                        }
                      }
                    }
                    local_90->keepon = KEEPON_DONE;
                  }
                  else {
                    if (((data == (Curl_easy *)0x0) || (((data->set).field_0x8cd & 0x10) == 0)) ||
                       ((pcVar1 = (data->state).feat, pcVar1 != (curl_trc_feat *)0x0 &&
                        (pcVar1->log_level < 1)))) goto LAB_001139f6;
                    Curl_infof(data,"Ignore chunked response-body");
                  }
                }
                else {
                  if (((data == (Curl_easy *)0x0) || (((data->set).field_0x8cd & 0x10) == 0)) ||
                     ((pcVar1 = (data->state).feat, pcVar1 != (curl_trc_feat *)0x0 &&
                      (pcVar1->log_level < 1)))) {
LAB_001139f6:
                    lVar12 = 2;
                    goto LAB_00113588;
                  }
                  Curl_infof(data,"Ignore %ld bytes of response-body");
                }
              }
              else {
                local_90->keepon = KEEPON_DONE;
              }
            } while (local_90->keepon != KEEPON_DONE);
            CVar6 = CURLE_OK;
            if (local_7c != 0) {
              CVar6 = CURLE_RECV_ERROR;
            }
          }
          phVar11 = local_90;
          local_92 = local_90->keepon == KEEPON_DONE;
          if (CVar6 == CURLE_OK && local_92) {
            if ((data->info).httpproxycode - 200U < 100) goto LAB_00113adc;
            CVar6 = Curl_http_auth_act(data);
          }
        }
        else {
LAB_00113adc:
          CVar6 = CURLE_OK;
        }
LAB_00113ade:
        iVar7 = Curl_pgrsUpdate(data);
        if (iVar7 == 0) {
          if (CVar6 == CURLE_OK) {
            bVar13 = false;
            if (local_92 != true) goto LAB_00113c60;
            h1_tunnel_go_state(cf,phVar11,H1_TUNNEL_RESPONSE,data);
            CVar6 = CURLE_OK;
            goto switchD_0011324b_caseD_3;
          }
        }
        else {
          CVar6 = CURLE_ABORTED_BY_CALLBACK;
        }
        break;
      case H1_TUNNEL_RESPONSE:
switchD_0011324b_caseD_3:
        if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) {
          pcVar1 = (data->state).feat;
          if (pcVar1 == (curl_trc_feat *)0x0) {
            if (cf != (Curl_cfilter *)0x0) goto LAB_00113b58;
          }
          else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar1->log_level)) {
LAB_00113b58:
            if (0 < cf->cft->log_level) {
              Curl_trc_cf_infof(data,cf,"CONNECT response");
            }
          }
        }
        if ((data->req).newurl != (char *)0x0) {
          Curl_req_soft_reset(local_40,data);
          if (((phVar11->field_0xac & 2) != 0) || (((ulong)local_60->bits & 0x20) != 0)) {
            if (data != (Curl_easy *)0x0) {
              if (((data->set).field_0x8cd & 0x10) != 0) {
                pcVar1 = (data->state).feat;
                if (pcVar1 == (curl_trc_feat *)0x0) {
                  if (cf != (Curl_cfilter *)0x0) goto LAB_00113be8;
                }
                else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar1->log_level)) {
LAB_00113be8:
                  if (0 < cf->cft->log_level) {
                    Curl_trc_cf_infof(data,cf,"CONNECT need to close+open");
                  }
                }
              }
              if ((((data->set).field_0x8cd & 0x10) != 0) &&
                 ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 ||
                  (0 < pcVar1->log_level)))) {
                Curl_infof(data,"Connect me again please");
              }
            }
            Curl_conn_cf_close(cf,data);
            bVar13 = false;
            Curl_conncontrol(local_60,0);
            CVar6 = Curl_conn_cf_connect(cf->next,data,false,&local_92);
            goto LAB_00113c60;
          }
          h1_tunnel_go_state(cf,phVar11,H1_TUNNEL_INIT,data);
        }
      default:
        bVar13 = true;
        goto LAB_00113c60;
      }
      bVar13 = false;
LAB_00113c60:
      if (!bVar13) goto LAB_00113cd1;
    } while ((data->req).newurl != (char *)0x0);
    if ((data->info).httpproxycode - 200U < 100) {
      h1_tunnel_go_state(cf,phVar11,H1_TUNNEL_ESTABLISHED,data);
      CVar6 = CURLE_OK;
      if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
         ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 ||
          (CVar6 = CURLE_OK, 0 < pcVar1->log_level)))) {
        CVar6 = CURLE_OK;
        Curl_infof(data,"CONNECT tunnel established, response %d",
                   (ulong)(uint)(data->info).httpproxycode);
      }
LAB_00113cd1:
      if (CVar6 != CURLE_OK) {
        h1_tunnel_go_state(cf,phVar11,H1_TUNNEL_FAILED,data);
      }
      goto LAB_00113d42;
    }
    (*Curl_cfree)((void *)0x0);
    (data->req).newurl = (char *)0x0;
    Curl_conncontrol(local_60,2);
    h1_tunnel_go_state(cf,phVar11,H1_TUNNEL_FAILED,data);
    Curl_failf(data,"CONNECT tunnel failed, response %d",(ulong)(uint)(data->req).httpcode);
  }
  else {
    if (phVar11->tunnel_state == H1_TUNNEL_ESTABLISHED) {
      CVar6 = CURLE_OK;
      goto LAB_00113d42;
    }
    if (phVar11->tunnel_state != H1_TUNNEL_FAILED) goto LAB_001131e0;
  }
  CVar6 = CURLE_RECV_ERROR;
LAB_00113d42:
  if (CVar6 == CURLE_OK) {
    (*Curl_cfree)((data->state).aptr.proxyuserpwd);
    (data->state).aptr.proxyuserpwd = (char *)0x0;
    if (cf->ctx != (void *)0x0) {
      bVar13 = *(int *)((long)cf->ctx + 0xa8) == 4;
      *done = bVar13;
      if (!bVar13) {
        return CURLE_OK;
      }
      cf->field_0x24 = cf->field_0x24 | 1;
      Curl_req_soft_reset(&data->req,data);
      Curl_client_reset(data);
      Curl_pgrsSetUploadCounter(data,0);
      Curl_pgrsSetDownloadCounter(data,0);
      tunnel_free(cf,data);
      return CURLE_OK;
    }
  }
  *done = false;
  return CVar6;
}

Assistant:

static CURLcode cf_h1_proxy_connect(struct Curl_cfilter *cf,
                                    struct Curl_easy *data,
                                    bool blocking, bool *done)
{
  CURLcode result;
  struct h1_tunnel_state *ts = cf->ctx;

  if(cf->connected) {
    *done = TRUE;
    return CURLE_OK;
  }

  CURL_TRC_CF(data, cf, "connect");
  result = cf->next->cft->do_connect(cf->next, data, blocking, done);
  if(result || !*done)
    return result;

  *done = FALSE;
  if(!ts) {
    result = tunnel_init(cf, data, &ts);
    if(result)
      return result;
    cf->ctx = ts;
  }

  /* TODO: can we do blocking? */
  /* We want "seamless" operations through HTTP proxy tunnel */

  result = H1_CONNECT(cf, data, ts);
  if(result)
    goto out;
  Curl_safefree(data->state.aptr.proxyuserpwd);

out:
  *done = (result == CURLE_OK) && tunnel_is_established(cf->ctx);
  if(*done) {
    cf->connected = TRUE;
    /* The real request will follow the CONNECT, reset request partially */
    Curl_req_soft_reset(&data->req, data);
    Curl_client_reset(data);
    Curl_pgrsSetUploadCounter(data, 0);
    Curl_pgrsSetDownloadCounter(data, 0);

    tunnel_free(cf, data);
  }
  return result;
}